

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype QtPrivate::lastIndexOf
                    (QStringView haystack,qsizetype from,char16_t needle,CaseSensitivity cs)

{
  qsizetype qVar1;
  undefined6 in_register_0000000a;
  undefined4 in_register_00000084;
  CaseSensitivity in_R9D;
  QStringView haystack_00;
  
  haystack_00.m_data = (storage_type_conflict *)haystack.m_size;
  haystack_00.m_size = CONCAT62(in_register_0000000a,needle) & 0xffffffff;
  qVar1 = anon_unknown.dwarf_2f1671::qLastIndexOf<QStringView>
                    ((anon_unknown_dwarf_2f1671 *)haystack.m_data,haystack_00,(QChar)(char16_t)from,
                     CONCAT44(in_register_00000084,cs),in_R9D);
  return qVar1;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, char16_t needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, QChar(needle), from, cs);
}